

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

bool __thiscall
KeyPair::SignSchnorr(KeyPair *this,uint256 *hash,Span<unsigned_char> sig,uint256 *aux)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  secp256k1_keypair *keypair_00;
  secp256k1_xonly_pubkey *in_RSI;
  secp256k1_context *in_RDI;
  int *in_R8;
  long in_FS_OFFSET;
  bool ret;
  secp256k1_keypair *keypair;
  secp256k1_xonly_pubkey pubkey_verify;
  secp256k1_xonly_pubkey *in_stack_00000168;
  size_t in_stack_00000170;
  uchar *in_stack_00000178;
  uchar *in_stack_00000180;
  secp256k1_context *in_stack_00000188;
  Span<unsigned_char> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  secp256k1_keypair *in_stack_ffffffffffffff38;
  uchar *in_stack_ffffffffffffff40;
  uchar *in_stack_ffffffffffffff48;
  secp256k1_context *ctx;
  bool local_81;
  bool local_59;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar5 = Span<unsigned_char>::size(in_stack_ffffffffffffff28);
  if (sVar5 != 0x40) {
    __assert_fail("sig.size() == 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x1ac,
                  "bool KeyPair::SignSchnorr(const uint256 &, Span<unsigned char>, const uint256 &) const"
                 );
  }
  bVar2 = IsValid((KeyPair *)in_stack_ffffffffffffff28);
  if (bVar2) {
    std::
    unique_ptr<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
    ::operator->((unique_ptr<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
                  *)in_stack_ffffffffffffff28);
    keypair_00 = (secp256k1_keypair *)
                 std::array<unsigned_char,_96UL>::data
                           ((array<unsigned_char,_96UL> *)in_stack_ffffffffffffff28);
    ctx = secp256k1_context_sign;
    Span<unsigned_char>::data(in_stack_ffffffffffffff28);
    base_blob<256U>::data((base_blob<256U> *)in_stack_ffffffffffffff28);
    base_blob<256U>::data((base_blob<256U> *)in_stack_ffffffffffffff28);
    iVar3 = secp256k1_schnorrsig_sign32
                      (ctx,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff38,
                       (uchar *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    local_81 = iVar3 != 0;
    if (local_81) {
      iVar3 = secp256k1_keypair_xonly_pub(in_RDI,in_RSI,in_R8,keypair_00);
      Span<unsigned_char>::data(in_stack_ffffffffffffff28);
      base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffff28);
      uVar4 = secp256k1_schnorrsig_verify
                        (in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170,
                         in_stack_00000168);
      local_81 = (iVar3 != 0 & uVar4) != 0;
    }
    if (local_81 == false) {
      Span<unsigned_char>::data(in_stack_ffffffffffffff28);
      Span<unsigned_char>::size(in_stack_ffffffffffffff28);
      memory_cleanse(in_stack_ffffffffffffff28,0x1ed87e);
    }
    local_59 = local_81;
  }
  else {
    local_59 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_59;
  }
  __stack_chk_fail();
}

Assistant:

bool KeyPair::SignSchnorr(const uint256& hash, Span<unsigned char> sig, const uint256& aux) const
{
    assert(sig.size() == 64);
    if (!IsValid()) return false;
    auto keypair = reinterpret_cast<const secp256k1_keypair*>(m_keypair->data());
    bool ret = secp256k1_schnorrsig_sign32(secp256k1_context_sign, sig.data(), hash.data(), keypair, aux.data());
    if (ret) {
        // Additional verification step to prevent using a potentially corrupted signature
        secp256k1_xonly_pubkey pubkey_verify;
        ret = secp256k1_keypair_xonly_pub(secp256k1_context_static, &pubkey_verify, nullptr, keypair);
        ret &= secp256k1_schnorrsig_verify(secp256k1_context_static, sig.data(), hash.begin(), 32, &pubkey_verify);
    }
    if (!ret) memory_cleanse(sig.data(), sig.size());
    return ret;
}